

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall kj::Path::evalPart(Path *this,Vector<kj::String> *parts,ArrayPtr<const_char> part)

{
  String *pSVar1;
  size_t sVar2;
  String *pSVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  _func_int **__s;
  String local_68;
  Fault f;
  String local_48;
  String local_30;
  
  pcVar5 = part.ptr;
  if (pcVar5 != (char *)0x0) {
    if (pcVar5 == (char *)0x2) {
      if ((*(char *)&(parts->builder).ptr == '.') &&
         (*(char *)((long)&(parts->builder).ptr + 1) == '.')) {
        if ((String *)(this->parts).size_ == (this->parts).ptr) {
          evalPart();
          return;
        }
        ArrayBuilder<kj::String>::removeLast((ArrayBuilder<kj::String> *)this);
        return;
      }
    }
    else if ((pcVar5 == (char *)0x1) && (*(char *)&(parts->builder).ptr == '.')) {
      return;
    }
    heapString(&local_68,(char *)parts,(size_t)pcVar5);
    sVar6 = local_68.content.size_;
    __s = (_func_int **)local_68.content.size_;
    if ((_func_int **)local_68.content.size_ != (_func_int **)0x0) {
      __s = (_func_int **)local_68.content.ptr;
    }
    sVar2 = strlen((char *)__s);
    sVar4 = 0;
    if ((_func_int **)sVar6 != (_func_int **)0x0) {
      sVar4 = sVar6 - 1;
    }
    if (sVar2 != sVar4) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::String&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x142,FAILED,"strlen(str.begin()) == str.size()",
                 "\"NUL character in path component\", str",
                 (char (*) [32])"NUL character in path component",&local_68);
      local_30.content.ptr = local_68.content.ptr;
      local_30.content.size_ = local_68.content.size_;
      local_30.content.disposer = local_68.content.disposer;
      local_68.content.ptr = (char *)0x0;
      local_68.content.size_ = 0;
      stripNul(&local_48,&local_30);
      sVar6 = local_68.content.size_;
      pcVar5 = local_68.content.ptr;
      if (local_68.content.ptr != (char *)0x0) {
        local_68.content.ptr = (char *)0x0;
        local_68.content.size_ = 0;
        (**(local_68.content.disposer)->_vptr_ArrayDisposer)
                  (local_68.content.disposer,pcVar5,1,sVar6,sVar6,0);
      }
      local_68.content.ptr = local_48.content.ptr;
      local_68.content.size_ = local_48.content.size_;
      local_68.content.disposer = local_48.content.disposer;
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      String::~String(&local_48);
      String::~String(&local_30);
      _::Debug::Fault::~Fault(&f);
    }
    pSVar3 = (String *)(this->parts).size_;
    if (pSVar3 == (String *)(this->parts).disposer) {
      pSVar1 = (this->parts).ptr;
      sVar6 = 4;
      if (pSVar3 != pSVar1) {
        sVar6 = ((long)pSVar3 - (long)pSVar1 >> 3) * 0x5555555555555556;
      }
      Vector<kj::String>::setCapacity((Vector<kj::String> *)this,sVar6);
      pSVar3 = (String *)(this->parts).size_;
    }
    (pSVar3->content).ptr = local_68.content.ptr;
    (pSVar3->content).size_ = local_68.content.size_;
    (pSVar3->content).disposer = local_68.content.disposer;
    (this->parts).size_ = (size_t)(pSVar3 + 1);
  }
  return;
}

Assistant:

void Path::evalPart(Vector<String>& parts, ArrayPtr<const char> part) {
  if (part.size() == 0) {
    // Ignore consecutive or trailing '/'s.
  } else if (part.size() == 1 && part[0] == '.') {
    // Refers to current directory; ignore.
  } else if (part.size() == 2 && part[0] == '.' && part [1] == '.') {
    KJ_REQUIRE(parts.size() > 0, "can't use \"..\" to break out of starting directory") {
      // When exceptions are disabled, ignore.
      return;
    }
    parts.removeLast();
  } else {
    auto str = heapString(part);
    KJ_REQUIRE(strlen(str.begin()) == str.size(), "NUL character in path component", str) {
      // When exceptions are disabled, strip out '\0' chars.
      str = stripNul(kj::mv(str));
      break;
    }
    parts.add(kj::mv(str));
  }
}